

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O1

string * __thiscall
wallet::RecurseImportData_abi_cxx11_
          (string *__return_storage_ptr__,wallet *this,CScript *script,ImportData *import_data,
          ScriptContext script_ctx)

{
  uchar *data;
  pointer puVar1;
  string_view func;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  TxoutType TVar4;
  CRIPEMD160 *this_00;
  mapped_type_conflict *pmVar5;
  UniValue *pUVar6;
  NonFatalCheckError *this_01;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ScriptContext script_ctx_00;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  string_view msg;
  string_view file;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  solverdata;
  type subscript;
  CScriptID id;
  CPubKey pubkey;
  undefined1 local_f8 [16];
  pointer local_e8;
  undefined1 local_d8 [8];
  size_type sStack_d0;
  uint32_t local_c8;
  CScriptID local_b8;
  undefined1 local_98 [96];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_f8 = (undefined1  [16])0x0;
  local_e8 = (pointer)0x0;
  TVar4 = Solver((CScript *)this,
                 (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_f8);
  iVar8 = (int)import_data;
  switch(TVar4) {
  case NONSTANDARD:
  case ANCHOR:
  case WITNESS_V1_TAPROOT:
  case WITNESS_UNKNOWN:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"unrecognized script","");
    break;
  case PUBKEY:
    CPubKey::Set<unsigned_char_const*>
              ((CPubKey *)local_98,
               (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8._0_8_)->
               _M_impl).super__Vector_impl_data._M_start,
               (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8._0_8_)->
               _M_impl).super__Vector_impl_data._M_finish);
    CPubKey::GetID((CKeyID *)&local_b8,(CPubKey *)local_98);
    auVar3[0xf] = 0;
    auVar3._0_15_ = stack0xffffffffffffff29;
    _local_d8 = auVar3 << 8;
    std::
    _Rb_tree<CKeyID,std::pair<CKeyID_const,bool>,std::_Select1st<std::pair<CKeyID_const,bool>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,bool>>>
    ::_M_emplace_unique<CKeyID,bool>
              ((_Rb_tree<CKeyID,std::pair<CKeyID_const,bool>,std::_Select1st<std::pair<CKeyID_const,bool>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,bool>>>
                *)(script + 2),(CKeyID *)&local_b8,(bool *)local_d8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    break;
  case PUBKEYHASH:
    puVar1 = (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8._0_8_)->
             _M_impl).super__Vector_impl_data._M_start;
    if ((long)(((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8._0_8_)->
              _M_impl).super__Vector_impl_data._M_finish - (long)puVar1 != 0x14) {
LAB_005b2d83:
      __assert_fail("vch.size() == WIDTH",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/uint256.h"
                    ,0x2a,"base_blob<160>::base_blob(Span<const unsigned char>) [BITS = 160]");
    }
    memcpy(&local_b8,puVar1,0x14);
    local_98[0] = (string)local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                          _M_elems[0];
    local_98[1] = local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[1];
    local_98[2] = local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[2];
    local_98[3] = local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[3];
    local_98[4] = local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[4];
    local_98[5] = local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[5];
    local_98[6] = local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[6];
    local_98[7] = local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[7];
    local_98[8] = local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[8];
    local_98[9] = local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[9];
    local_98[10] = local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[10]
    ;
    local_98[0xb] =
         local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xb];
    local_98[0xc] =
         local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xc];
    local_98[0xd] =
         local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xd];
    local_98[0xe] =
         local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xe];
    local_98[0xf] =
         local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xf];
    local_98[0x10] =
         local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x10];
    local_98[0x11] =
         local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x11];
    local_98[0x12] =
         local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x12];
    local_98[0x13] =
         local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x13];
    pmVar5 = std::
             map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>::
             operator[]((map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
                         *)(script + 2),(key_type *)local_98);
    *pmVar5 = true;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    break;
  case SCRIPTHASH:
    if (iVar8 == 2) {
      pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
      local_98._0_8_ = local_98 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"Trying to nest P2SH inside a P2WSH","");
      JSONRPCError(pUVar6,-5,(string *)local_98);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar6,&::UniValue::typeinfo,::UniValue::~UniValue);
      }
      goto LAB_005b3177;
    }
    if (iVar8 == 1) {
      pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
      local_98._0_8_ = local_98 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"Trying to nest P2SH inside another P2SH","");
      JSONRPCError(pUVar6,-5,(string *)local_98);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar6,&::UniValue::typeinfo,::UniValue::~UniValue);
      }
      goto LAB_005b3177;
    }
    local_98[0] = (string)(iVar8 == 0);
    script_ctx_00 = 0x85007f;
    inline_check_non_fatal<bool>
              ((bool *)local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/backup.cpp"
               ,0x368,"RecurseImportData","script_ctx == ScriptContext::TOP");
    puVar1 = (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8._0_8_)->
             _M_impl).super__Vector_impl_data._M_start;
    if ((long)(((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8._0_8_)->
              _M_impl).super__Vector_impl_data._M_finish - (long)puVar1 != 0x14) goto LAB_005b2d83;
    memcpy(local_98,puVar1,0x14);
    local_d8 = (undefined1  [8])(script->super_CScriptBase)._union.indirect_contents.indirect;
    (script->super_CScriptBase)._union.indirect_contents.indirect = (char *)0x0;
    if (local_d8 == (undefined1  [8])0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"missing redeemscript","");
    }
    else {
      CScriptID::CScriptID(&local_b8,(CScript *)local_d8);
      auVar11[0] = -(local_98[0] ==
                    (string)local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                            _M_elems[0]);
      auVar11[1] = -(local_98[1] ==
                    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[1]
                    );
      auVar11[2] = -(local_98[2] ==
                    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[2]
                    );
      auVar11[3] = -(local_98[3] ==
                    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[3]
                    );
      auVar11[4] = -(local_98[4] ==
                    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[4]
                    );
      auVar11[5] = -(local_98[5] ==
                    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[5]
                    );
      auVar11[6] = -(local_98[6] ==
                    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[6]
                    );
      auVar11[7] = -(local_98[7] ==
                    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[7]
                    );
      auVar11[8] = -(local_98[8] ==
                    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[8]
                    );
      auVar11[9] = -(local_98[9] ==
                    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[9]
                    );
      auVar11[10] = -(local_98[10] ==
                     local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                     [10]);
      auVar11[0xb] = -(local_98[0xb] ==
                      local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                      [0xb]);
      auVar11[0xc] = -(local_98[0xc] ==
                      local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                      [0xc]);
      auVar11[0xd] = -(local_98[0xd] ==
                      local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                      [0xd]);
      auVar11[0xe] = -(local_98[0xe] ==
                      local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                      [0xe]);
      auVar11[0xf] = -(local_98[0xf] ==
                      local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                      [0xf]);
      auVar13[0] = -((char)local_98._16_4_ ==
                    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                    [0x10]);
      auVar13[1] = -(SUB41(local_98._16_4_,1) ==
                    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                    [0x11]);
      auVar13[2] = -(SUB41(local_98._16_4_,2) ==
                    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                    [0x12]);
      auVar13[3] = -(SUB41(local_98._16_4_,3) ==
                    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                    [0x13]);
      auVar13[4] = 0xff;
      auVar13[5] = 0xff;
      auVar13[6] = 0xff;
      auVar13[7] = 0xff;
      auVar13[8] = 0xff;
      auVar13[9] = 0xff;
      auVar13[10] = 0xff;
      auVar13[0xb] = 0xff;
      auVar13[0xc] = 0xff;
      auVar13[0xd] = 0xff;
      auVar13[0xe] = 0xff;
      auVar13[0xf] = 0xff;
      auVar11 = auVar11 & auVar13;
      if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff) {
        std::
        _Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
        ::_M_emplace_unique<CScript&>
                  ((_Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
                    *)((script->super_CScriptBase)._union.direct + 0x10),(CScript *)local_d8);
        RecurseImportData_abi_cxx11_
                  (__return_storage_ptr__,(wallet *)local_d8,script,(ImportData *)0x1,script_ctx_00)
        ;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"redeemScript does not match the scriptPubKey",
                   "");
      }
    }
    goto LAB_005b2d39;
  case MULTISIG:
    if (2 < (ulong)(((long)(local_f8._8_8_ - local_f8._0_8_) >> 3) * -0x5555555555555555)) {
      uVar7 = 2;
      lVar9 = 0x20;
      do {
        CPubKey::Set<unsigned_char_const*>
                  ((CPubKey *)local_98,*(uchar **)(local_f8._0_8_ + lVar9 + -8),
                   *(uchar **)
                    ((long)&(((pointer)local_f8._0_8_)->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start + lVar9));
        CPubKey::GetID((CKeyID *)&local_b8,(CPubKey *)local_98);
        auVar2[0xf] = 0;
        auVar2._0_15_ = stack0xffffffffffffff29;
        _local_d8 = auVar2 << 8;
        std::
        _Rb_tree<CKeyID,std::pair<CKeyID_const,bool>,std::_Select1st<std::pair<CKeyID_const,bool>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,bool>>>
        ::_M_emplace_unique<CKeyID,bool>
                  ((_Rb_tree<CKeyID,std::pair<CKeyID_const,bool>,std::_Select1st<std::pair<CKeyID_const,bool>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,bool>>>
                    *)(script + 2),(CKeyID *)&local_b8,(bool *)local_d8);
        uVar7 = uVar7 + 1;
        lVar9 = lVar9 + 0x18;
      } while (uVar7 < (ulong)(((long)(local_f8._8_8_ - local_f8._0_8_) >> 3) * -0x5555555555555555)
              );
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    break;
  case NULL_DATA:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"unspendable script","");
    break;
  case WITNESS_V0_SCRIPTHASH:
    if (iVar8 == 2) {
      pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
      local_98._0_8_ = local_98 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"Trying to nest P2WSH inside another P2WSH","");
      JSONRPCError(pUVar6,-5,(string *)local_98);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar6,&::UniValue::typeinfo,::UniValue::~UniValue);
      }
      goto LAB_005b3177;
    }
    data = (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8._0_8_)->_M_impl
           ).super__Vector_impl_data._M_start;
    puVar1 = (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8._0_8_)->
             _M_impl).super__Vector_impl_data._M_finish;
    _local_d8 = (undefined1  [16])0x0;
    local_c8 = 0;
    CRIPEMD160::CRIPEMD160((CRIPEMD160 *)local_98);
    this_00 = CRIPEMD160::Write((CRIPEMD160 *)local_98,data,(long)puVar1 - (long)data);
    CRIPEMD160::Finalize(this_00,local_d8);
    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0] = local_d8[0];
    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[1] = local_d8[1];
    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[2] = local_d8[2];
    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[3] = local_d8[3];
    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[4] = local_d8[4];
    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[5] = local_d8[5];
    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[6] = local_d8[6];
    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[7] = local_d8[7];
    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[8] =
         (undefined1)sStack_d0;
    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[9] =
         sStack_d0._1_1_;
    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[10] =
         sStack_d0._2_1_;
    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xb] =
         sStack_d0._3_1_;
    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xc] =
         sStack_d0._4_1_;
    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xd] =
         sStack_d0._5_1_;
    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xe] =
         sStack_d0._6_1_;
    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xf] =
         sStack_d0._7_1_;
    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x10] =
         (undefined1)local_c8;
    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x11] =
         local_c8._1_1_;
    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x12] =
         local_c8._2_1_;
    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x13] =
         local_c8._3_1_;
    local_d8 = *(undefined1 (*) [8])((long)&(script->super_CScriptBase)._union + 8);
    *(undefined8 *)((long)&(script->super_CScriptBase)._union + 8) = 0;
    if (local_d8 == (undefined1  [8])0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"missing witnessscript","");
    }
    else {
      CScriptID::CScriptID((CScriptID *)local_98,(CScript *)local_d8);
      auVar10[0] = -(local_98[0] ==
                    (string)local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                            _M_elems[0]);
      auVar10[1] = -(local_98[1] ==
                    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[1]
                    );
      auVar10[2] = -(local_98[2] ==
                    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[2]
                    );
      auVar10[3] = -(local_98[3] ==
                    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[3]
                    );
      auVar10[4] = -(local_98[4] ==
                    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[4]
                    );
      auVar10[5] = -(local_98[5] ==
                    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[5]
                    );
      auVar10[6] = -(local_98[6] ==
                    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[6]
                    );
      auVar10[7] = -(local_98[7] ==
                    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[7]
                    );
      auVar10[8] = -(local_98[8] ==
                    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[8]
                    );
      auVar10[9] = -(local_98[9] ==
                    local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[9]
                    );
      auVar10[10] = -(local_98[10] ==
                     local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                     [10]);
      auVar10[0xb] = -(local_98[0xb] ==
                      local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                      [0xb]);
      auVar10[0xc] = -(local_98[0xc] ==
                      local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                      [0xc]);
      auVar10[0xd] = -(local_98[0xd] ==
                      local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                      [0xd]);
      auVar10[0xe] = -(local_98[0xe] ==
                      local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                      [0xe]);
      auVar10[0xf] = -(local_98[0xf] ==
                      local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                      [0xf]);
      auVar12[0] = -(local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                     [0x10] == (char)local_98._16_4_);
      auVar12[1] = -(local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                     [0x11] == SUB41(local_98._16_4_,1));
      auVar12[2] = -(local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                     [0x12] == SUB41(local_98._16_4_,2));
      auVar12[3] = -(local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems
                     [0x13] == SUB41(local_98._16_4_,3));
      auVar12[4] = 0xff;
      auVar12[5] = 0xff;
      auVar12[6] = 0xff;
      auVar12[7] = 0xff;
      auVar12[8] = 0xff;
      auVar12[9] = 0xff;
      auVar12[10] = 0xff;
      auVar12[0xb] = 0xff;
      auVar12[0xc] = 0xff;
      auVar12[0xd] = 0xff;
      auVar12[0xe] = 0xff;
      auVar12[0xf] = 0xff;
      auVar10 = auVar10 & auVar12;
      if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff) {
        if (iVar8 == 0) {
          std::
          _Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
          ::_M_emplace_unique<CScript_const&>
                    ((_Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
                      *)((script->super_CScriptBase)._union.direct + 0x10),(CScript *)this);
        }
        std::
        _Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
        ::_M_emplace_unique<CScript&>
                  ((_Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
                    *)((script->super_CScriptBase)._union.direct + 0x10),(CScript *)local_d8);
        RecurseImportData_abi_cxx11_
                  (__return_storage_ptr__,(wallet *)local_d8,script,(ImportData *)0x2,script_ctx);
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,
                   "witnessScript does not match the scriptPubKey or redeemScript","");
      }
    }
LAB_005b2d39:
    if (local_d8 != (undefined1  [8])0x0) {
      std::default_delete<CScript>::operator()
                ((default_delete<CScript> *)local_d8,(CScript *)local_d8);
    }
    break;
  case WITNESS_V0_KEYHASH:
    if (iVar8 == 2) {
      pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
      local_98._0_8_ = local_98 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"Trying to nest P2WPKH inside P2WSH","");
      JSONRPCError(pUVar6,-5,(string *)local_98);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar6,&::UniValue::typeinfo,::UniValue::~UniValue);
      }
      goto LAB_005b3177;
    }
    puVar1 = (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8._0_8_)->
             _M_impl).super__Vector_impl_data._M_start;
    if ((long)(((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8._0_8_)->
              _M_impl).super__Vector_impl_data._M_finish - (long)puVar1 != 0x14) goto LAB_005b2d83;
    memcpy(&local_b8,puVar1,0x14);
    local_98[0] = (string)local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data.
                          _M_elems[0];
    local_98[1] = local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[1];
    local_98[2] = local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[2];
    local_98[3] = local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[3];
    local_98[4] = local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[4];
    local_98[5] = local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[5];
    local_98[6] = local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[6];
    local_98[7] = local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[7];
    local_98[8] = local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[8];
    local_98[9] = local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[9];
    local_98[10] = local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[10]
    ;
    local_98[0xb] =
         local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xb];
    local_98[0xc] =
         local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xc];
    local_98[0xd] =
         local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xd];
    local_98[0xe] =
         local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xe];
    local_98[0xf] =
         local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xf];
    local_98[0x10] =
         local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x10];
    local_98[0x11] =
         local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x11];
    local_98[0x12] =
         local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x12];
    local_98[0x13] =
         local_b8.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x13];
    pmVar5 = std::
             map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>::
             operator[]((map<CKeyID,_bool,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_bool>_>_>
                         *)(script + 2),(key_type *)local_98);
    *pmVar5 = true;
    if (iVar8 == 0) {
      std::
      _Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>::
      _M_emplace_unique<CScript_const&>
                ((_Rb_tree<CScript,CScript,std::_Identity<CScript>,std::less<CScript>,std::allocator<CScript>>
                  *)((script->super_CScriptBase)._union.direct + 0x10),(CScript *)this);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    break;
  default:
    this_01 = (NonFatalCheckError *)__cxa_allocate_exception(0x10);
    func._M_str = "RecurseImportData";
    func._M_len = 0x11;
    msg._M_str = "Unreachable code reached (non-fatal)";
    msg._M_len = 0x24;
    file._M_str = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/backup.cpp"
    ;
    file._M_len = 0x65;
    NonFatalCheckError::NonFatalCheckError(this_01,msg,file,0x394,func);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this_01,&NonFatalCheckError::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_005b3177;
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)local_f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_005b3177:
  __stack_chk_fail();
}

Assistant:

static std::string RecurseImportData(const CScript& script, ImportData& import_data, const ScriptContext script_ctx)
{
    // Use Solver to obtain script type and parsed pubkeys or hashes:
    std::vector<std::vector<unsigned char>> solverdata;
    TxoutType script_type = Solver(script, solverdata);

    switch (script_type) {
    case TxoutType::PUBKEY: {
        CPubKey pubkey(solverdata[0]);
        import_data.used_keys.emplace(pubkey.GetID(), false);
        return "";
    }
    case TxoutType::PUBKEYHASH: {
        CKeyID id = CKeyID(uint160(solverdata[0]));
        import_data.used_keys[id] = true;
        return "";
    }
    case TxoutType::SCRIPTHASH: {
        if (script_ctx == ScriptContext::P2SH) throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Trying to nest P2SH inside another P2SH");
        if (script_ctx == ScriptContext::WITNESS_V0) throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Trying to nest P2SH inside a P2WSH");
        CHECK_NONFATAL(script_ctx == ScriptContext::TOP);
        CScriptID id = CScriptID(uint160(solverdata[0]));
        auto subscript = std::move(import_data.redeemscript); // Remove redeemscript from import_data to check for superfluous script later.
        if (!subscript) return "missing redeemscript";
        if (CScriptID(*subscript) != id) return "redeemScript does not match the scriptPubKey";
        import_data.import_scripts.emplace(*subscript);
        return RecurseImportData(*subscript, import_data, ScriptContext::P2SH);
    }
    case TxoutType::MULTISIG: {
        for (size_t i = 1; i + 1< solverdata.size(); ++i) {
            CPubKey pubkey(solverdata[i]);
            import_data.used_keys.emplace(pubkey.GetID(), false);
        }
        return "";
    }
    case TxoutType::WITNESS_V0_SCRIPTHASH: {
        if (script_ctx == ScriptContext::WITNESS_V0) throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Trying to nest P2WSH inside another P2WSH");
        CScriptID id{RIPEMD160(solverdata[0])};
        auto subscript = std::move(import_data.witnessscript); // Remove redeemscript from import_data to check for superfluous script later.
        if (!subscript) return "missing witnessscript";
        if (CScriptID(*subscript) != id) return "witnessScript does not match the scriptPubKey or redeemScript";
        if (script_ctx == ScriptContext::TOP) {
            import_data.import_scripts.emplace(script); // Special rule for IsMine: native P2WSH requires the TOP script imported (see script/ismine.cpp)
        }
        import_data.import_scripts.emplace(*subscript);
        return RecurseImportData(*subscript, import_data, ScriptContext::WITNESS_V0);
    }
    case TxoutType::WITNESS_V0_KEYHASH: {
        if (script_ctx == ScriptContext::WITNESS_V0) throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Trying to nest P2WPKH inside P2WSH");
        CKeyID id = CKeyID(uint160(solverdata[0]));
        import_data.used_keys[id] = true;
        if (script_ctx == ScriptContext::TOP) {
            import_data.import_scripts.emplace(script); // Special rule for IsMine: native P2WPKH requires the TOP script imported (see script/ismine.cpp)
        }
        return "";
    }
    case TxoutType::NULL_DATA:
        return "unspendable script";
    case TxoutType::NONSTANDARD:
    case TxoutType::WITNESS_UNKNOWN:
    case TxoutType::WITNESS_V1_TAPROOT:
    case TxoutType::ANCHOR:
        return "unrecognized script";
    } // no default case, so the compiler can warn about missing cases
    NONFATAL_UNREACHABLE();
}